

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdICHull.cpp
# Opt level: O1

bool __thiscall HACD::ICHUll::AddPoints(ICHUll *this,Vec3<double> *points,size_t nPoints)

{
  CircularListElement<HACD::TMMVertex> *pCVar1;
  double *pdVar2;
  size_t sVar3;
  
  if (nPoints != 0 && points != (Vec3<double> *)0x0) {
    pdVar2 = points->m_data + 2;
    sVar3 = 0;
    do {
      pCVar1 = CircularList<HACD::TMMVertex>::Add(&(this->m_mesh).m_vertices,(TMMVertex *)0x0);
      (pCVar1->m_data).m_pos.m_data[0] = ((Vec3<double> *)(pdVar2 + -2))->m_data[0];
      (pCVar1->m_data).m_pos.m_data[1] = pdVar2[-1];
      (pCVar1->m_data).m_pos.m_data[2] = *pdVar2;
      (pCVar1->m_data).m_name = sVar3;
      sVar3 = sVar3 + 1;
      pdVar2 = pdVar2 + 3;
    } while (nPoints != sVar3);
  }
  return points != (Vec3<double> *)0x0;
}

Assistant:

bool ICHUll::AddPoints(const Vec3<Real> * points, size_t nPoints)
	{
		if (!points)
		{
			return false;
		}
		CircularListElement<TMMVertex> * vertex = NULL;
		for (size_t i = 0; i < nPoints; i++)
		{
			vertex = m_mesh.AddVertex();
			vertex->GetData().m_pos.X() = points[i].X();
			vertex->GetData().m_pos.Y() = points[i].Y();
			vertex->GetData().m_pos.Z() = points[i].Z();
            vertex->GetData().m_name = static_cast<long>(i);
		}     
		return true;
	}